

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O0

bool __thiscall
sptk::reaper::EpochTracker::WriteDebugData
          (EpochTracker *this,vector<float,_std::allocator<float>_> *data,string *extension)

{
  uint uVar1;
  ulong uVar2;
  size_type sVar3;
  undefined8 uVar4;
  char *__filename;
  FILE *pFVar5;
  const_reference __ptr;
  size_t sVar6;
  vector<float,_std::allocator<float>_> *in_RSI;
  size_t written;
  FILE *out;
  string filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  char *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  string local_60 [32];
  string local_40 [40];
  vector<float,_std::allocator<float>_> *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                   in_stack_ffffffffffffff30);
    std::__cxx11::string::~string(local_60);
    sVar3 = std::vector<float,_std::allocator<float>_>::size(local_18);
    pFVar5 = _stdout;
    if (sVar3 == 0) {
      uVar4 = std::__cxx11::string::c_str();
      fprintf(pFVar5,"Data size==0 for %s in WriteDebugData\n",uVar4);
      local_1 = 0;
    }
    else {
      __filename = (char *)std::__cxx11::string::c_str();
      pFVar5 = fopen(__filename,"w");
      if (pFVar5 == (FILE *)0x0) {
        pFVar5 = _stderr;
        uVar4 = std::__cxx11::string::c_str();
        fprintf(pFVar5,"Can\'t open %s for debug output\n",uVar4);
        local_1 = 0;
      }
      else {
        __ptr = std::vector<float,_std::allocator<float>_>::front
                          ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff30);
        sVar3 = std::vector<float,_std::allocator<float>_>::size(local_18);
        sVar6 = fwrite(__ptr,4,sVar3,pFVar5);
        fclose(pFVar5);
        sVar3 = std::vector<float,_std::allocator<float>_>::size(local_18);
        if (sVar6 == sVar3) {
          local_1 = 1;
        }
        else {
          uVar1 = (uint)sVar6;
          pFVar5 = _stderr;
          sVar3 = std::vector<float,_std::allocator<float>_>::size(local_18);
          fprintf(pFVar5,"Problems writing debug data (%d %d)\n",(ulong)uVar1,sVar3 & 0xffffffff);
          local_1 = 0;
        }
      }
    }
    std::__cxx11::string::~string(local_40);
  }
  else {
    local_1 = 1;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool EpochTracker::WriteDebugData(const std::vector<float>& data,
                                  const std::string& extension) {
  if (debug_name_.empty()) {
    return true;
  }
  std::string filename = debug_name_ + "." + extension;
  if (data.size() == 0) {
    fprintf(stdout, "Data size==0 for %s in WriteDebugData\n",
               filename.c_str());
    return false;
  }
  FILE* out = fopen(filename.c_str(), "w");
  if (!out) {
    fprintf(stderr, "Can't open %s for debug output\n", filename.c_str());
    return false;
  }
  size_t  written = fwrite(&(data.front()), sizeof(data.front()),
                           data.size(), out);
  fclose(out);
  if (written != data.size()) {
    fprintf(stderr, "Problems writing debug data (%d %d)\n",
            static_cast<int>(written), static_cast<int>(data.size()));
    return false;
  }
  return true;
}